

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall CNumber<30>::shortest(CNumber<30> *this,type *right)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = this->m_number;
  iVar2 = right->m_number;
  iVar3 = iVar1 - iVar2;
  if (iVar1 < iVar2) {
    uVar4 = (iVar2 - iVar1) % 0x1e + 0x1e;
    uVar5 = (uVar4 / 0x1e) * -0x1f + uVar4 / 0x1e + (iVar2 - iVar1) % 0x1e + 0x1e;
    uVar4 = iVar3 % 0x1e + 0x1e;
    uVar6 = (uVar4 / 0x1e) * -0x1f + uVar4 / 0x1e + iVar3 % 0x1e + 0x1e;
    uVar4 = -uVar6;
    if (uVar5 < uVar6) {
      uVar4 = uVar5;
    }
  }
  else {
    uVar4 = iVar3 % 0x1e + 0x1e;
    uVar6 = (uVar4 / 0x1e) * -0x1f + uVar4 / 0x1e + iVar3 % 0x1e + 0x1e;
    uVar4 = (iVar2 - iVar1) % 0x1e + 0x1e;
    uVar5 = uVar4 / 0x1e + uVar4 / 0x1e + (uVar4 / 0x1e) * -0x20 + (iVar2 - iVar1) % 0x1e + 0x1e;
    uVar4 = -uVar5;
    if (uVar6 < uVar5) {
      uVar4 = uVar6;
    }
    uVar4 = -uVar4;
  }
  return uVar4;
}

Assistant:

int shortest(const type& right) const
        {
            // 1, 20 mod 30
            // 20 - 1 = 19
            // 1 - 20 = -19 mod 30 = 11
            if (*this < right)
            {
                return shortest_helper(right);
            }
            return -right.shortest_helper(*this);
        }